

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O1

void __thiscall btMLCPSolver::createMLCPFast(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btMatrixXf *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  btSolverConstraint **ppbVar7;
  float *pfVar8;
  float *pfVar9;
  btSolverConstraint *pbVar10;
  btSolverBody *pbVar11;
  btRigidBody *pbVar12;
  btRigidBody *pbVar13;
  btContactSolverInfo *pbVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  btJointNode *pbVar18;
  int *piVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  btScalar *pbVar34;
  btScalar *C;
  long lVar35;
  uint uVar36;
  btAlignedObjectArray<btJointNode> jointNodeArray;
  btAlignedObjectArray<int> bodyJointNodeArray;
  btVector3 relPosCrossNormalInvInertia;
  btVector3 normalInvMass;
  btAlignedObjectArray<btJointNode> local_f0;
  long local_d0;
  float *local_c8;
  float *local_c0;
  long local_b8;
  long local_b0;
  int local_a4;
  btAlignedObjectArray<int> local_a0;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  long local_60;
  btContactSolverInfo *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  uVar36 = (uint)interleaveContactAndFriction;
  uVar15 = (this->m_allConstraintPtrArray).m_size;
  uVar33 = (ulong)uVar15;
  CProfileManager::Start_Profile("init b (rhs)");
  btVectorX<float>::resize(&this->m_b,uVar15);
  btVectorX<float>::resize(&this->m_bSplit,uVar15);
  lVar24 = (long)(this->m_b).m_storage.m_size;
  if (lVar24 != 0) {
    memset((this->m_b).m_storage.m_data,0,lVar24 << 2);
  }
  lVar24 = (long)(this->m_bSplit).m_storage.m_size;
  if (lVar24 != 0) {
    memset((this->m_bSplit).m_storage.m_data,0,lVar24 << 2);
  }
  if (0 < (int)uVar15) {
    ppbVar7 = (this->m_allConstraintPtrArray).m_data;
    pfVar8 = (this->m_b).m_storage.m_data;
    pfVar9 = (this->m_bSplit).m_storage.m_data;
    uVar26 = 0;
    do {
      pbVar10 = ppbVar7[uVar26];
      fVar3 = pbVar10->m_jacDiagABInv;
      if (1.1920929e-07 <= ABS(fVar3)) {
        fVar4 = pbVar10->m_rhsPenetration;
        pfVar8[uVar26] = pbVar10->m_rhs / fVar3;
        pfVar9[uVar26] = fVar4 / fVar3;
      }
      uVar26 = uVar26 + 1;
    } while (uVar33 != uVar26);
  }
  CProfileManager::Stop_Profile();
  btVectorX<float>::resize(&this->m_lo,uVar15);
  btVectorX<float>::resize(&this->m_hi,uVar15);
  CProfileManager::Start_Profile("init lo/ho");
  if (0 < (int)uVar15) {
    ppbVar7 = (this->m_allConstraintPtrArray).m_data;
    pfVar8 = (this->m_lo).m_storage.m_data;
    pfVar9 = (this->m_hi).m_storage.m_data;
    uVar26 = 0;
    do {
      pbVar10 = ppbVar7[uVar26];
      pfVar8[uVar26] = pbVar10->m_lowerLimit;
      pfVar9[uVar26] = pbVar10->m_upperLimit;
      uVar26 = uVar26 + 1;
    } while (uVar33 != uVar26);
  }
  CProfileManager::Stop_Profile();
  iVar21 = (this->m_allConstraintPtrArray).m_size;
  iVar22 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_size;
  local_a0.m_ownsMemory = true;
  local_a0.m_data = (int *)0x0;
  local_a0.m_size = 0;
  local_a0.m_capacity = 0;
  local_68 = uVar33;
  local_58 = infoGlobal;
  CProfileManager::Start_Profile("bodyJointNodeArray.resize");
  iVar31 = local_a0.m_size;
  lVar24 = (long)local_a0.m_size;
  if (local_a0.m_size <= iVar22) {
    if ((local_a0.m_size < iVar22) && (local_a0.m_capacity < iVar22)) {
      if (iVar22 == 0) {
        piVar17 = (int *)0x0;
      }
      else {
        piVar17 = (int *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
      }
      if (0 < (long)local_a0.m_size) {
        lVar25 = 0;
        do {
          piVar17[lVar25] = local_a0.m_data[lVar25];
          lVar25 = lVar25 + 1;
        } while (local_a0.m_size != lVar25);
      }
      if ((local_a0.m_data != (int *)0x0) && (local_a0.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_a0.m_data);
      }
      local_a0.m_ownsMemory = true;
      local_a0.m_capacity = iVar22;
      local_a0.m_data = piVar17;
    }
    if (iVar31 < iVar22) {
      memset(local_a0.m_data + lVar24,0xff,(iVar22 - lVar24) * 4);
    }
  }
  local_a0.m_size = iVar22;
  CProfileManager::Stop_Profile();
  local_f0.m_ownsMemory = true;
  local_f0.m_data = (btJointNode *)0x0;
  local_f0.m_size = 0;
  local_f0.m_capacity = 0;
  CProfileManager::Start_Profile("jointNodeArray.reserve");
  iVar22 = (this->m_allConstraintPtrArray).m_size;
  if (local_f0.m_capacity < iVar22 * 2) {
    if (iVar22 == 0) {
      pbVar18 = (btJointNode *)0x0;
    }
    else {
      pbVar18 = (btJointNode *)btAlignedAllocInternal((long)iVar22 << 5,0x10);
    }
    if (0 < (long)local_f0.m_size) {
      lVar24 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar24);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar24);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar24 = lVar24 + 0x10;
      } while ((long)local_f0.m_size * 0x10 != lVar24);
    }
    if ((local_f0.m_data != (btJointNode *)0x0) && (local_f0.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_f0.m_data);
    }
    local_f0.m_ownsMemory = true;
    local_f0.m_data = pbVar18;
    local_f0.m_capacity = iVar22 * 2;
  }
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::J3 == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("J3.resize");
  iVar21 = iVar21 * 2;
  btMatrixX<float>::resize(&createMLCPFast::J3,iVar21,8);
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::JinvM3 == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("JinvM3.resize/setZero");
  btMatrixX<float>::resize(&createMLCPFast::JinvM3,iVar21,8);
  btMatrixX<float>::setZero(&createMLCPFast::JinvM3);
  btMatrixX<float>::setZero(&createMLCPFast::J3);
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::ofs == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("ofs resize");
  iVar21 = createMLCPFast::ofs.m_size;
  lVar24 = (long)createMLCPFast::ofs.m_size;
  if (lVar24 < 1) {
    if ((createMLCPFast::ofs.m_size < 0) && (createMLCPFast::ofs.m_capacity < 0)) {
      if ((createMLCPFast::ofs.m_data != (int *)0x0) && (createMLCPFast::ofs.m_ownsMemory == true))
      {
        btAlignedFreeInternal(createMLCPFast::ofs.m_data);
      }
      createMLCPFast::ofs.m_ownsMemory = true;
      createMLCPFast::ofs.m_data = (int *)0x0;
      createMLCPFast::ofs.m_capacity = 0;
    }
    if (iVar21 < 0) {
      memset(createMLCPFast::ofs.m_data + lVar24,0,lVar24 * -4);
    }
  }
  createMLCPFast::ofs.m_size = 0;
  iVar21 = (this->m_allConstraintPtrArray).m_size;
  if ((0 < (long)iVar21) && (createMLCPFast::ofs.m_capacity < iVar21)) {
    piVar19 = (int *)btAlignedAllocInternal((long)iVar21 << 2,0x10);
    piVar17 = createMLCPFast::ofs.m_data;
    lVar24 = (long)createMLCPFast::ofs.m_size;
    if (0 < lVar24) {
      lVar25 = 0;
      do {
        piVar19[lVar25] = piVar17[lVar25];
        lVar25 = lVar25 + 1;
      } while (lVar24 != lVar25);
    }
    if ((createMLCPFast::ofs.m_data != (int *)0x0) && (createMLCPFast::ofs.m_ownsMemory == true)) {
      btAlignedFreeInternal(createMLCPFast::ofs.m_data);
    }
    createMLCPFast::ofs.m_ownsMemory = true;
    createMLCPFast::ofs.m_capacity = iVar21;
    createMLCPFast::ofs.m_data = piVar19;
  }
  createMLCPFast::ofs.m_size = iVar21;
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("Compute J and JinvM");
  uVar15 = uVar36 * 2 + 1;
  if (0 < (this->m_allConstraintPtrArray).m_size) {
    lVar24 = 0;
    uVar33 = 0;
    iVar22 = 0;
    iVar21 = 0;
    do {
      iVar31 = local_f0.m_size;
      createMLCPFast::ofs.m_data[lVar24] = iVar22;
      uVar36 = uVar15;
      if (iVar21 < (this->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar36 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
                 [lVar24].m_numConstraintRows;
      }
      local_c8 = (float *)(ulong)uVar36;
      local_60 = (long)iVar21;
      pbVar10 = (this->m_allConstraintPtrArray).m_data[local_60];
      lVar25 = (long)pbVar10->m_solverBodyIdA;
      lVar32 = (long)pbVar10->m_solverBodyIdB;
      pbVar11 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
      pbVar12 = pbVar11[lVar25].m_originalBody;
      pbVar13 = pbVar11[lVar32].m_originalBody;
      local_d0 = CONCAT44(local_d0._4_4_,iVar21);
      local_a4 = iVar22;
      if (pbVar12 == (btRigidBody *)0x0) {
        uVar33 = (ulong)((int)uVar33 + uVar36);
      }
      else {
        if (local_f0.m_size == local_f0.m_capacity) {
          iVar22 = local_f0.m_size * 2;
          if (local_f0.m_size == 0) {
            iVar22 = 1;
          }
          if (local_f0.m_capacity < iVar22) {
            local_b8 = lVar32;
            local_b0 = lVar25;
            if (iVar22 == 0) {
              pbVar18 = (btJointNode *)0x0;
            }
            else {
              pbVar18 = (btJointNode *)btAlignedAllocInternal((long)iVar22 << 4,0x10);
            }
            if (0 < (long)local_f0.m_size) {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar25);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar25);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar25 = lVar25 + 0x10;
              } while ((long)local_f0.m_size * 0x10 != lVar25);
            }
            if ((local_f0.m_data != (btJointNode *)0x0) && (local_f0.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_f0.m_data);
            }
            local_f0.m_ownsMemory = true;
            lVar25 = local_b0;
            lVar32 = local_b8;
            iVar21 = (int)local_d0;
            local_f0.m_data = pbVar18;
            local_f0.m_capacity = iVar22;
          }
        }
        lVar20 = (long)iVar31;
        local_f0.m_size = local_f0.m_size + 1;
        pbVar18 = local_f0.m_data + lVar20;
        pbVar18->jointIndex = 0;
        pbVar18->otherBodyIndex = 0;
        pbVar18->nextJointNodeIndex = 0;
        pbVar18->constraintRowIndex = 0;
        iVar22 = local_a0.m_data[lVar25];
        local_a0.m_data[lVar25] = iVar31;
        local_f0.m_data[lVar20].nextJointNodeIndex = iVar22;
        local_f0.m_data[lVar20].jointIndex = (int)lVar24;
        local_f0.m_data[lVar20].constraintRowIndex = iVar21;
        local_f0.m_data[lVar20].otherBodyIndex =
             -(uint)(pbVar13 == (btRigidBody *)0x0) | (uint)lVar32;
        pfVar9 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar8 = createMLCPFast::J3.m_storage.m_data;
        if (0 < (int)local_c8) {
          local_6c = createMLCPFast::JinvM3.m_setElemOperations;
          lVar29 = (long)createMLCPFast::J3.m_cols;
          lVar27 = (long)createMLCPFast::JinvM3.m_cols;
          uVar33 = (ulong)(int)uVar33;
          local_74 = (int)local_c8 * 8;
          createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + local_74
          ;
          ppbVar7 = (this->m_allConstraintPtrArray).m_data;
          lVar35 = (long)createMLCPFast::JinvM3.m_storage.m_data + uVar33 * 4 * lVar27 + 0x10;
          local_c0 = (float *)(lVar27 * 4);
          lVar20 = (long)createMLCPFast::J3.m_storage.m_data + uVar33 * 4 * lVar29 + 0x10;
          uVar26 = 0;
          do {
            pbVar10 = ppbVar7[local_60 + uVar26];
            fVar3 = pbVar12->m_inverseMass;
            uVar6 = *(undefined8 *)(pbVar10->m_contactNormal1).m_floats;
            local_40._4_4_ = fVar3 * (float)((ulong)uVar6 >> 0x20);
            local_40._0_4_ = fVar3 * (float)uVar6;
            local_40._8_4_ = fVar3 * (pbVar10->m_contactNormal1).m_floats[2];
            local_40._12_4_ = 0;
            fVar3 = (pbVar10->m_relpos1CrossNormal).m_floats[0];
            fVar4 = (pbVar10->m_relpos1CrossNormal).m_floats[1];
            fVar5 = (pbVar10->m_relpos1CrossNormal).m_floats[2];
            uVar6 = *(undefined8 *)&(pbVar12->super_btCollisionObject).field_0x14c;
            local_50._4_4_ =
                 fVar5 * (float)((ulong)*(undefined8 *)&pbVar12->field_0x16c >> 0x20) +
                 fVar3 * (float)((ulong)uVar6 >> 0x20) +
                 (float)((ulong)*(undefined8 *)&pbVar12->field_0x15c >> 0x20) * fVar4;
            local_50._0_4_ =
                 fVar5 * (float)*(undefined8 *)&pbVar12->field_0x16c +
                 fVar3 * (float)uVar6 + (float)*(undefined8 *)&pbVar12->field_0x15c * fVar4;
            local_50._8_4_ =
                 fVar5 * *(float *)&pbVar12->field_0x174 +
                 fVar3 * *(float *)&pbVar12->field_0x154 + fVar4 * *(float *)&pbVar12->field_0x164;
            local_50._12_4_ = 0;
            lVar23 = 0;
            do {
              *(undefined4 *)(lVar20 + lVar23 + -0x10) =
                   *(undefined4 *)((long)(pbVar10->m_contactNormal1).m_floats + lVar23);
              *(undefined4 *)(lVar20 + lVar23) =
                   *(undefined4 *)((long)(pbVar10->m_relpos1CrossNormal).m_floats + lVar23);
              *(undefined4 *)(lVar35 + lVar23 + -0x10) = *(undefined4 *)(local_40 + lVar23);
              *(undefined4 *)(lVar35 + lVar23) = *(undefined4 *)(local_50 + lVar23);
              lVar23 = lVar23 + 4;
            } while (lVar23 != 0xc);
            pfVar8[uVar33 * lVar29 + 3] = 0.0;
            pfVar9[uVar33 * lVar27 + 3] = 0.0;
            pfVar8[uVar33 * lVar29 + 7] = 0.0;
            pfVar9[uVar33 * lVar27 + 7] = 0.0;
            uVar26 = uVar26 + 1;
            uVar33 = uVar33 + 1;
            lVar35 = lVar35 + lVar27 * 4;
            lVar20 = lVar20 + lVar29 * 4;
          } while (uVar26 != ((ulong)local_c8 & 0xffffffff));
          createMLCPFast::JinvM3.m_setElemOperations =
               createMLCPFast::JinvM3.m_setElemOperations + local_74;
          iVar21 = (int)local_d0;
          local_b8 = lVar32;
          local_b0 = lVar25;
          local_80 = lVar24;
          local_70 = createMLCPFast::J3.m_setElemOperations;
        }
      }
      iVar22 = local_f0.m_size;
      iVar31 = (int)local_c8;
      if (pbVar13 == (btRigidBody *)0x0) {
        uVar33 = (ulong)(uint)((int)uVar33 + iVar31);
      }
      else {
        if (local_f0.m_size == local_f0.m_capacity) {
          iVar31 = local_f0.m_size * 2;
          if (local_f0.m_size == 0) {
            iVar31 = 1;
          }
          if (local_f0.m_capacity < iVar31) {
            local_b8 = lVar32;
            local_b0 = lVar25;
            if (iVar31 == 0) {
              pbVar18 = (btJointNode *)0x0;
            }
            else {
              pbVar18 = (btJointNode *)btAlignedAllocInternal((long)iVar31 << 4,0x10);
            }
            if (0 < (long)local_f0.m_size) {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar25);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar25);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar25 = lVar25 + 0x10;
              } while ((long)local_f0.m_size * 0x10 != lVar25);
            }
            if ((local_f0.m_data != (btJointNode *)0x0) && (local_f0.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_f0.m_data);
            }
            local_f0.m_ownsMemory = true;
            lVar25 = local_b0;
            lVar32 = local_b8;
            iVar21 = (int)local_d0;
            local_f0.m_data = pbVar18;
            local_f0.m_capacity = iVar31;
          }
        }
        lVar20 = (long)iVar22;
        local_f0.m_size = local_f0.m_size + 1;
        pbVar18 = local_f0.m_data + lVar20;
        pbVar18->jointIndex = 0;
        pbVar18->otherBodyIndex = 0;
        pbVar18->nextJointNodeIndex = 0;
        pbVar18->constraintRowIndex = 0;
        iVar31 = local_a0.m_data[lVar32];
        local_a0.m_data[lVar32] = iVar22;
        local_f0.m_data[lVar20].nextJointNodeIndex = iVar31;
        local_f0.m_data[lVar20].jointIndex = (int)lVar24;
        local_f0.m_data[lVar20].otherBodyIndex =
             -(uint)(pbVar12 == (btRigidBody *)0x0) | (uint)lVar25;
        local_f0.m_data[lVar20].constraintRowIndex = iVar21;
        pfVar9 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar8 = createMLCPFast::J3.m_storage.m_data;
        iVar31 = (int)local_c8;
        if (0 < iVar31) {
          local_c0 = (float *)CONCAT44(local_c0._4_4_,createMLCPFast::JinvM3.m_setElemOperations);
          lVar32 = (long)createMLCPFast::J3.m_cols;
          lVar25 = (long)createMLCPFast::JinvM3.m_cols;
          uVar33 = (ulong)(int)uVar33;
          iVar21 = iVar31 * 8;
          local_b8 = CONCAT44(local_b8._4_4_,iVar21);
          createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + iVar21;
          local_b0 = CONCAT44(local_b0._4_4_,createMLCPFast::J3.m_setElemOperations);
          ppbVar7 = (this->m_allConstraintPtrArray).m_data;
          lVar20 = (long)createMLCPFast::JinvM3.m_storage.m_data + uVar33 * 4 * lVar25 + 0x10;
          lVar27 = (long)createMLCPFast::J3.m_storage.m_data + uVar33 * 4 * lVar32 + 0x10;
          uVar26 = 0;
          do {
            pbVar10 = ppbVar7[local_60 + uVar26];
            fVar3 = pbVar13->m_inverseMass;
            uVar6 = *(undefined8 *)(pbVar10->m_contactNormal2).m_floats;
            local_40._4_4_ = fVar3 * (float)((ulong)uVar6 >> 0x20);
            local_40._0_4_ = fVar3 * (float)uVar6;
            local_40._8_4_ = fVar3 * (pbVar10->m_contactNormal2).m_floats[2];
            local_40._12_4_ = 0;
            fVar3 = (pbVar10->m_relpos2CrossNormal).m_floats[0];
            fVar4 = (pbVar10->m_relpos2CrossNormal).m_floats[1];
            fVar5 = (pbVar10->m_relpos2CrossNormal).m_floats[2];
            uVar6 = *(undefined8 *)&(pbVar13->super_btCollisionObject).field_0x14c;
            local_50._4_4_ =
                 fVar5 * (float)((ulong)*(undefined8 *)&pbVar13->field_0x16c >> 0x20) +
                 fVar3 * (float)((ulong)uVar6 >> 0x20) +
                 (float)((ulong)*(undefined8 *)&pbVar13->field_0x15c >> 0x20) * fVar4;
            local_50._0_4_ =
                 fVar5 * (float)*(undefined8 *)&pbVar13->field_0x16c +
                 fVar3 * (float)uVar6 + (float)*(undefined8 *)&pbVar13->field_0x15c * fVar4;
            local_50._8_4_ =
                 fVar5 * *(float *)&pbVar13->field_0x174 +
                 fVar3 * *(float *)&pbVar13->field_0x154 + fVar4 * *(float *)&pbVar13->field_0x164;
            local_50._12_4_ = 0;
            lVar29 = 0;
            do {
              *(undefined4 *)(lVar27 + lVar29 + -0x10) =
                   *(undefined4 *)((long)(pbVar10->m_contactNormal2).m_floats + lVar29);
              *(undefined4 *)(lVar27 + lVar29) =
                   *(undefined4 *)((long)(pbVar10->m_relpos2CrossNormal).m_floats + lVar29);
              *(undefined4 *)(lVar20 + lVar29 + -0x10) = *(undefined4 *)(local_40 + lVar29);
              *(undefined4 *)(lVar20 + lVar29) = *(undefined4 *)(local_50 + lVar29);
              lVar29 = lVar29 + 4;
            } while (lVar29 != 0xc);
            pfVar8[uVar33 * lVar32 + 3] = 0.0;
            pfVar9[uVar33 * lVar25 + 3] = 0.0;
            pfVar8[uVar33 * lVar32 + 7] = 0.0;
            pfVar9[uVar33 * lVar25 + 7] = 0.0;
            uVar26 = uVar26 + 1;
            uVar33 = uVar33 + 1;
            lVar20 = lVar20 + lVar25 * 4;
            lVar27 = lVar27 + lVar32 * 4;
          } while (uVar26 != ((ulong)local_c8 & 0xffffffff));
          createMLCPFast::JinvM3.m_setElemOperations =
               createMLCPFast::JinvM3.m_setElemOperations + iVar21;
          iVar21 = (int)local_d0;
          local_80 = lVar24;
        }
      }
      iVar22 = local_a4 + iVar31;
      iVar21 = iVar21 + iVar31;
      lVar24 = lVar24 + 1;
    } while (iVar21 < (this->m_allConstraintPtrArray).m_size);
  }
  CProfileManager::Stop_Profile();
  uVar33 = local_68;
  local_c0 = (float *)0x0;
  local_c8 = (float *)0x0;
  if (createMLCPFast::JinvM3.m_storage.m_size != 0) {
    local_c8 = createMLCPFast::JinvM3.m_storage.m_data;
  }
  if (createMLCPFast::J3.m_storage.m_size != 0) {
    local_c0 = createMLCPFast::J3.m_storage.m_data;
  }
  CProfileManager::Start_Profile("m_A.resize");
  this_00 = &this->m_A;
  btMatrixX<float>::resize(this_00,(int)uVar33,(int)uVar33);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("m_A.setZero");
  btMatrixX<float>::setZero(this_00);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("Compute A");
  if (0 < (this->m_allConstraintPtrArray).m_size) {
    lVar24 = 0;
    iVar21 = 0;
    do {
      uVar36 = uVar15;
      if (iVar21 < (this->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar36 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.m_data
                 [lVar24].m_numConstraintRows;
      }
      iVar22 = createMLCPFast::ofs.m_data[lVar24];
      pbVar10 = (this->m_allConstraintPtrArray).m_data[iVar21];
      iVar31 = pbVar10->m_solverBodyIdA;
      local_d0 = (long)pbVar10->m_solverBodyIdB;
      pbVar34 = local_c8 + (long)iVar22 * 0x10;
      local_a4 = iVar21;
      for (uVar16 = local_a0.m_data[iVar31]; -1 < (int)uVar16;
          uVar16 = local_f0.m_data[uVar16].nextJointNodeIndex) {
        lVar25 = (long)local_f0.m_data[uVar16].jointIndex;
        if (lVar25 < lVar24) {
          uVar30 = uVar15;
          if (local_f0.m_data[uVar16].constraintRowIndex <
              (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
              m_size) {
            uVar30 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.
                     m_data[lVar25].m_numConstraintRows;
          }
          if ((this->m_allConstraintPtrArray).m_data[local_f0.m_data[uVar16].constraintRowIndex]->
              m_solverBodyIdB == iVar31) {
            iVar21 = uVar30 * 8;
          }
          else {
            iVar21 = 0;
          }
          btMatrixX<float>::multiplyAdd2_p8r
                    (this_00,pbVar34,
                     local_c0 + (long)createMLCPFast::ofs.m_data[lVar25] * 0x10 + (long)iVar21,
                     uVar36,uVar30,iVar22,createMLCPFast::ofs.m_data[lVar25]);
        }
      }
      uVar16 = local_a0.m_data[local_d0];
      if (-1 < (int)uVar16) {
        do {
          lVar25 = (long)local_f0.m_data[uVar16].jointIndex;
          if (lVar25 < lVar24) {
            uVar30 = uVar15;
            if (local_f0.m_data[uVar16].constraintRowIndex <
                (this->super_btSequentialImpulseConstraintSolver).
                m_tmpSolverNonContactConstraintPool.m_size) {
              uVar30 = (this->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.
                       m_data[lVar25].m_numConstraintRows;
            }
            if ((this->m_allConstraintPtrArray).m_data[local_f0.m_data[uVar16].constraintRowIndex]->
                m_solverBodyIdB == (int)local_d0) {
              iVar21 = uVar30 * 8;
            }
            else {
              iVar21 = 0;
            }
            btMatrixX<float>::multiplyAdd2_p8r
                      (this_00,pbVar34 + (long)(int)uVar36 * 8,
                       local_c0 + (long)createMLCPFast::ofs.m_data[lVar25] * 0x10 + (long)iVar21,
                       uVar36,uVar30,iVar22,createMLCPFast::ofs.m_data[lVar25]);
          }
          uVar16 = local_f0.m_data[uVar16].nextJointNodeIndex;
        } while (-1 < (int)uVar16);
      }
      iVar21 = local_a4 + uVar36;
      lVar24 = lVar24 + 1;
    } while (iVar21 < (this->m_allConstraintPtrArray).m_size);
  }
  CProfileManager::Start_Profile("compute diagonal");
  iVar21 = (this->m_allConstraintPtrArray).m_size;
  local_d0 = CONCAT44(local_d0._4_4_,iVar21);
  if (0 < iVar21) {
    lVar24 = 0;
    iVar21 = 0;
    do {
      uVar36 = uVar15;
      if (iVar21 < (this->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar36 = *(uint *)((long)&((this->super_btSequentialImpulseConstraintSolver).
                                   m_tmpConstraintSizesPool.m_data)->m_numConstraintRows + lVar24);
      }
      lVar25 = (long)iVar21;
      pbVar12 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data
                [(this->m_allConstraintPtrArray).m_data[lVar25]->m_solverBodyIdB].m_originalBody;
      pbVar34 = local_c8 + lVar25 * 0x10;
      C = local_c0 + lVar25 * 0x10;
      btMatrixX<float>::multiply2_p8r(this_00,pbVar34,C,uVar36,uVar36,iVar21,iVar21);
      if (pbVar12 != (btRigidBody *)0x0) {
        btMatrixX<float>::multiplyAdd2_p8r
                  (this_00,pbVar34 + (ulong)uVar36 * 8,C + (ulong)uVar36 * 8,uVar36,uVar36,iVar21,
                   iVar21);
      }
      iVar21 = iVar21 + uVar36;
      lVar24 = lVar24 + 8;
    } while (iVar21 < (int)local_d0);
  }
  CProfileManager::Stop_Profile();
  CProfileManager::Stop_Profile();
  pbVar14 = local_58;
  uVar33 = local_68;
  iVar21 = this_00->m_rows;
  lVar24 = (long)iVar21;
  if (0 < lVar24) {
    iVar22 = (this->m_A).m_cols;
    iVar31 = (this->m_A).m_setElemOperations;
    pfVar8 = (this->m_A).m_storage.m_data;
    iVar28 = 0;
    do {
      pfVar8[iVar28] =
           this->m_cfm / (local_58->super_btContactSolverInfoData).m_timeStep + pfVar8[iVar28];
      iVar28 = iVar28 + iVar22 + 1;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
    (this->m_A).m_setElemOperations = iVar21 + iVar31;
  }
  CProfileManager::Start_Profile("fill the upper triangle ");
  btMatrixX<float>::copyLowerToUpperTriangle(this_00);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("resize/init x");
  btVectorX<float>::resize(&this->m_x,(int)uVar33);
  btVectorX<float>::resize(&this->m_xSplit,(int)uVar33);
  if (((pbVar14->super_btContactSolverInfoData).m_solverMode & 4) == 0) {
    lVar24 = (long)(this->m_x).m_storage.m_size;
    if (lVar24 != 0) {
      memset((this->m_x).m_storage.m_data,0,lVar24 << 2);
    }
    lVar24 = (long)(this->m_xSplit).m_storage.m_size;
    if (lVar24 != 0) {
      memset((this->m_xSplit).m_storage.m_data,0,lVar24 << 2);
    }
  }
  else {
    lVar24 = (long)(this->m_allConstraintPtrArray).m_size;
    if (0 < lVar24) {
      ppbVar7 = (this->m_allConstraintPtrArray).m_data;
      pfVar8 = (this->m_x).m_storage.m_data;
      pfVar9 = (this->m_xSplit).m_storage.m_data;
      lVar25 = 0;
      do {
        pbVar10 = ppbVar7[lVar25];
        pfVar8[lVar25] = pbVar10->m_appliedImpulse;
        pfVar9[lVar25] = pbVar10->m_appliedPushImpulse;
        lVar25 = lVar25 + 1;
      } while (lVar24 != lVar25);
    }
  }
  CProfileManager::Stop_Profile();
  btAlignedObjectArray<btJointNode>::~btAlignedObjectArray(&local_f0);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_a0);
  return;
}

Assistant:

void btMLCPSolver::createMLCPFast(const btContactSolverInfo& infoGlobal)
{
	int numContactRows = interleaveContactAndFriction ? 3 : 1;

	int numConstraintRows = m_allConstraintPtrArray.size();
	int n = numConstraintRows;
	{
		BT_PROFILE("init b (rhs)");
		m_b.resize(numConstraintRows);
		m_bSplit.resize(numConstraintRows);
		m_b.setZero();
		m_bSplit.setZero();
		for (int i=0;i<numConstraintRows ;i++)
		{
			btScalar jacDiag = m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (!btFuzzyZero(jacDiag))
			{
				btScalar rhs = m_allConstraintPtrArray[i]->m_rhs;
				btScalar rhsPenetration = m_allConstraintPtrArray[i]->m_rhsPenetration;
				m_b[i]=rhs/jacDiag;
				m_bSplit[i] = rhsPenetration/jacDiag;
			}

		}
	}

//	btScalar* w = 0;
//	int nub = 0;

	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	{
		BT_PROFILE("init lo/ho");

		for (int i=0;i<numConstraintRows;i++)
		{
			if (0)//m_limitDependencies[i]>=0)
			{
				m_lo[i] = -BT_INFINITY;
				m_hi[i] = BT_INFINITY;
			} else
			{
				m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
				m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
			}
		}
	}

	//
	int m=m_allConstraintPtrArray.size();

	int numBodies = m_tmpSolverBodyPool.size();
	btAlignedObjectArray<int> bodyJointNodeArray;
	{
		BT_PROFILE("bodyJointNodeArray.resize");
		bodyJointNodeArray.resize(numBodies,-1);
	}
	btAlignedObjectArray<btJointNode> jointNodeArray;
	{
		BT_PROFILE("jointNodeArray.reserve");
		jointNodeArray.reserve(2*m_allConstraintPtrArray.size());
	}

	static btMatrixXu J3;
	{
		BT_PROFILE("J3.resize");
		J3.resize(2*m,8);
	}
	static btMatrixXu JinvM3;
	{
		BT_PROFILE("JinvM3.resize/setZero");

		JinvM3.resize(2*m,8);
		JinvM3.setZero();
		J3.setZero();
	}
	int cur=0;
	int rowOffset = 0;
	static btAlignedObjectArray<int> ofs;
	{
		BT_PROFILE("ofs resize");
		ofs.resize(0);
		ofs.resizeNoInitialize(m_allConstraintPtrArray.size());
	}				
	{
		BT_PROFILE("Compute J and JinvM");
		int c=0;

		int numRows = 0;

		for (int i=0;i<m_allConstraintPtrArray.size();i+=numRows,c++)
		{
			ofs[c] = rowOffset;
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
			btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
			if (orgBodyA)
			{
				{
					int slotA=-1;
					//find free jointNode slot for sbA
					slotA =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbA];
					bodyJointNodeArray[sbA] = slotA;
					jointNodeArray[slotA].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotA].jointIndex = c;
					jointNodeArray[slotA].constraintRowIndex = i;
					jointNodeArray[slotA].otherBodyIndex = orgBodyB ? sbB : -1;
				}
				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMass =				m_allConstraintPtrArray[i+row]->m_contactNormal1 *		orgBodyA->getInvMass();
					btVector3 relPosCrossNormalInvInertia = m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal *	orgBodyA->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal1[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMass[r]);
						JinvM3.setElem(cur,r+4,relPosCrossNormalInvInertia[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			} else
			{
				cur += numRows;
			}
			if (orgBodyB)
			{

				{
					int slotB=-1;
					//find free jointNode slot for sbA
					slotB =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbB];
					bodyJointNodeArray[sbB] = slotB;
					jointNodeArray[slotB].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotB].jointIndex = c;
					jointNodeArray[slotB].otherBodyIndex = orgBodyA ? sbA : -1;
					jointNodeArray[slotB].constraintRowIndex = i;
				}

				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMassB = m_allConstraintPtrArray[i+row]->m_contactNormal2*orgBodyB->getInvMass();
					btVector3 relPosInvInertiaB = m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal * orgBodyB->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal2[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMassB[r]);
						JinvM3.setElem(cur,r+4,relPosInvInertiaB[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			}
			else
			{
				cur += numRows;
			}
			rowOffset+=numRows;

		}
		
	}


	//compute JinvM = J*invM.
	const btScalar* JinvM = JinvM3.getBufferPointer();

	const btScalar* Jptr = J3.getBufferPointer();
	{
		BT_PROFILE("m_A.resize");
		m_A.resize(n,n);
	}
	
	{
		BT_PROFILE("m_A.setZero");
		m_A.setZero();
	}
	int c=0;
	{
		int numRows = 0;
		BT_PROFILE("Compute A");
		for (int i=0;i<m_allConstraintPtrArray.size();i+= numRows,c++)
		{
			int row__ = ofs[c];
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
		//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
					
			const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;

			{
				int startJointNodeA = bodyJointNodeArray[sbA];
				while (startJointNodeA>=0)
				{
					int j0 = jointNodeArray[startJointNodeA].jointIndex;
					int cr0 = jointNodeArray[startJointNodeA].constraintRowIndex;
					if (j0<c)
					{
								 
						int numRowsOther = cr0 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j0].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cr0]->m_solverBodyIdB == sbA) ? 8*numRowsOther  : 0;
						//printf("%d joint i %d and j0: %d: ",count++,i,j0);
						m_A.multiplyAdd2_p8r ( JinvMrow, 
						Jptr + 2*8*(size_t)ofs[j0] + ofsother, numRows, numRowsOther,  row__,ofs[j0]);
					}
					startJointNodeA = jointNodeArray[startJointNodeA].nextJointNodeIndex;
				}
			}

			{
				int startJointNodeB = bodyJointNodeArray[sbB];
				while (startJointNodeB>=0)
				{
					int j1 = jointNodeArray[startJointNodeB].jointIndex;
					int cj1 = jointNodeArray[startJointNodeB].constraintRowIndex;

					if (j1<c)
					{
						int numRowsOther =  cj1 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j1].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cj1]->m_solverBodyIdB == sbB) ? 8*numRowsOther  : 0;
						m_A.multiplyAdd2_p8r ( JinvMrow + 8*(size_t)numRows, 
						Jptr + 2*8*(size_t)ofs[j1] + ofsother, numRows, numRowsOther, row__,ofs[j1]);
					}
					startJointNodeB = jointNodeArray[startJointNodeB].nextJointNodeIndex;
				}
			}
		}

		{
			BT_PROFILE("compute diagonal");
			// compute diagonal blocks of m_A

			int  row__ = 0;
			int numJointRows = m_allConstraintPtrArray.size();

			int jj=0;
			for (;row__<numJointRows;)
			{

				//int sbA = m_allConstraintPtrArray[row__]->m_solverBodyIdA;
				int sbB = m_allConstraintPtrArray[row__]->m_solverBodyIdB;
			//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
				btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;


				const unsigned int infom =  row__ < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[jj].m_numConstraintRows : numContactRows;
				
				const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;
				const btScalar *Jrow = Jptr + 2*8*(size_t)row__;
				m_A.multiply2_p8r (JinvMrow, Jrow, infom, infom, row__,row__);
				if (orgBodyB) 
				{
					m_A.multiplyAdd2_p8r (JinvMrow + 8*(size_t)infom, Jrow + 8*(size_t)infom, infom, infom,  row__,row__);
				}
				row__ += infom;
				jj++;
			}
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}
				   
	///fill the upper triangle of the matrix, to make it symmetric
	{
		BT_PROFILE("fill the upper triangle ");
		m_A.copyLowerToUpperTriangle();
	}

	{
		BT_PROFILE("resize/init x");
		m_x.resize(numConstraintRows);
		m_xSplit.resize(numConstraintRows);

		if (infoGlobal.m_solverMode&SOLVER_USE_WARMSTARTING)
		{
			for (int i=0;i<m_allConstraintPtrArray.size();i++)
			{
				const btSolverConstraint& c = *m_allConstraintPtrArray[i];
				m_x[i]=c.m_appliedImpulse;
				m_xSplit[i] = c.m_appliedPushImpulse;
			}
		} else
		{
			m_x.setZero();
			m_xSplit.setZero();
		}
	}

}